

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool *pbVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  size_type sVar9;
  bool bVar10;
  int iVar11;
  bool *__dest;
  char *pcVar12;
  pointer pp_Var13;
  TemplateString local_1a8;
  TemplateDictionaryPeer peer;
  string dump;
  undefined8 local_150;
  undefined1 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  undefined8 uStack_138;
  char local_130;
  undefined2 uStack_12f;
  undefined4 uStack_12d;
  undefined1 uStack_129;
  undefined8 uStack_128;
  TemplateString local_120;
  bool *local_100;
  undefined8 uStack_f8;
  undefined1 local_f0;
  uint7 uStack_ef;
  undefined8 uStack_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined8 uStack_d8;
  undefined1 local_d0;
  uint7 uStack_cf;
  undefined8 uStack_c8;
  size_type __dnew;
  size_t local_b8;
  bool local_b0;
  TemplateId local_a8;
  TemplateDictionary dict;
  undefined7 uStack_8f;
  
  _dict = "GLOBAL";
  local_120.ptr_ = "top";
  local_120.length_ = 3;
  local_120.is_immutable_ = true;
  local_120.id_ = 0;
  TVar6._17_7_ = local_120._17_7_;
  TVar6.is_immutable_ = true;
  TVar3._17_7_ = uStack_8f;
  TVar3.is_immutable_ = true;
  TVar3.length_ = 6;
  TVar3.ptr_ = "GLOBAL";
  TVar3.id_ = 0;
  TVar6.length_ = 3;
  TVar6.ptr_ = "top";
  TVar6.id_ = 0;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar3,TVar6);
  for (pp_Var13 = g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pp_Var13 !=
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish; pp_Var13 = pp_Var13 + 1) {
    (**pp_Var13)();
  }
  fprintf(_stderr,"\nPassed %d tests\n\nPASS\n",
          (ulong)((long)g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_120.ptr_ = "test_SetValueWithNUL";
  local_120.length_ = 0x14;
  local_120.is_immutable_ = true;
  local_120.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_120,(UnsafeArena *)0x0);
  local_130 = 'F';
  uStack_12f = 0x4f4f;
  uStack_12d = 0x52414200;
  uStack_138 = 7;
  uStack_129 = 0;
  local_120.length_ = 7;
  local_120.is_immutable_ = false;
  local_120.id_ = 0;
  paVar1 = &dump.field_2;
  dump.field_2._M_allocated_capacity = 0x5855555100585551;
  dump._M_string_length = 8;
  dump.field_2._8_8_ = dump.field_2._8_8_ & 0xffffffffffffff00;
  uStack_d8 = 8;
  local_d0 = 0;
  uStack_c8 = 0;
  TVar4.length_ = 7;
  TVar4.ptr_ = &local_130;
  TVar4._16_8_ = (ulong)(uint7)local_120._17_7_ << 8;
  TVar4.id_ = 0;
  TVar7.length_ = 8;
  TVar7.ptr_ = (char *)paVar1;
  TVar7._16_8_ = (ulong)uStack_cf << 8;
  TVar7.id_ = 0;
  peer.dict_ = &dict;
  dump._M_dataplus._M_p = (pointer)paVar1;
  local_140 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&local_130;
  local_120.ptr_ = &local_130;
  local_e0 = paVar1;
  ctemplate::TemplateDictionary::SetValue(TVar4,TVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dump._M_dataplus._M_p != paVar1) {
    operator_delete(dump._M_dataplus._M_p);
  }
  if (local_140 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_130) {
    operator_delete(local_140);
  }
  dump._M_string_length = 7;
  uStack_138 = 7;
  local_130 = '\0';
  uStack_128 = 0;
  dump.field_2._M_allocated_capacity = 0x524147004f4f47;
  pbVar2 = &local_1a8.is_immutable_;
  local_1a8.is_immutable_ = true;
  local_1a8._17_7_ = 0x58555547005855;
  local_1a8.length_ = 8;
  local_1a8.id_ = local_1a8.id_ & 0xffffffffffffff00;
  uStack_f8 = 8;
  local_f0 = 0;
  uStack_e8 = 0;
  TVar5.length_ = 7;
  TVar5.ptr_ = (char *)paVar1;
  TVar5._16_8_ = (ulong)CONCAT16(uStack_129,CONCAT42(uStack_12d,uStack_12f)) << 8;
  TVar5.id_ = 0;
  TVar8.length_ = 8;
  TVar8.ptr_ = pbVar2;
  TVar8._16_8_ = (ulong)uStack_ef << 8;
  TVar8.id_ = 0;
  local_1a8.ptr_ = pbVar2;
  dump._M_dataplus._M_p = (pointer)paVar1;
  local_140 = paVar1;
  local_100 = pbVar2;
  ctemplate::TemplateDictionary::SetGlobalValue(TVar5,TVar8);
  if ((bool *)local_1a8.ptr_ != pbVar2) {
    operator_delete(local_1a8.ptr_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dump._M_dataplus._M_p != paVar1) {
    operator_delete(dump._M_dataplus._M_p);
  }
  dump._M_dataplus._M_p = "FOO";
  dump._M_string_length = 3;
  dump.field_2._M_local_buf[0] = 1;
  dump.field_2._8_8_ = 0;
  local_1a8.ptr_ = "";
  local_1a8.length_ = 0;
  local_1a8.is_immutable_ = true;
  local_1a8.id_ = 0;
  bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,(TemplateString *)&dump,&local_1a8);
  if (bVar10) {
    dump._M_dataplus._M_p = "GOO";
    dump._M_string_length = 3;
    dump.field_2._M_local_buf[0] = 1;
    dump.field_2._8_8_ = 0;
    local_1a8.ptr_ = "";
    local_1a8.length_ = 0;
    local_1a8.is_immutable_ = true;
    local_1a8.id_ = 0;
    bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs(&peer,(TemplateString *)&dump,&local_1a8);
    if (bVar10) {
      local_1a8.length_ = 7;
      local_1a8._16_8_ = 0x524142004f4f46;
      dump._M_string_length = 7;
      dump.field_2._M_allocated_capacity = dump.field_2._M_allocated_capacity & 0xffffffffffffff00;
      dump.field_2._8_8_ = 0;
      local_150 = 0x5855555100585551;
      local_148 = 0;
      local_b8 = 8;
      local_b0 = false;
      local_a8 = 0;
      local_1a8.ptr_ = pbVar2;
      dump._M_dataplus._M_p = pbVar2;
      __dnew = (size_type)&local_150;
      bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs
                         (&peer,(TemplateString *)&dump,(TemplateString *)&__dnew);
      if ((bool *)local_1a8.ptr_ != pbVar2) {
        operator_delete(local_1a8.ptr_);
      }
      if (bVar10) {
        local_1a8.length_ = 7;
        dump._M_string_length = 7;
        dump.field_2._M_allocated_capacity = dump.field_2._M_allocated_capacity & 0xffffffffffffff00
        ;
        dump.field_2._8_8_ = 0;
        local_1a8._16_8_ = 0x524147004f4f47;
        local_150 = 0x5855554700585547;
        local_148 = 0;
        local_b8 = 8;
        local_b0 = false;
        local_a8 = 0;
        local_1a8.ptr_ = pbVar2;
        dump._M_dataplus._M_p = pbVar2;
        __dnew = (size_type)&local_150;
        bVar10 = ctemplate::TemplateDictionaryPeer::ValueIs
                           (&peer,(TemplateString *)&dump,(TemplateString *)&__dnew);
        if ((bool *)local_1a8.ptr_ != pbVar2) {
          operator_delete(local_1a8.ptr_);
        }
        if (bVar10) {
          dump._M_string_length = 0;
          dump.field_2._M_allocated_capacity =
               dump.field_2._M_allocated_capacity & 0xffffffffffffff00;
          dump._M_dataplus._M_p = (pointer)paVar1;
          ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)&dump);
          __dnew = 0xa0;
          local_1a8.ptr_ = pbVar2;
          __dest = (bool *)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&__dnew);
          sVar9 = __dnew;
          local_1a8._16_8_ = __dnew;
          local_1a8.ptr_ = __dest;
          memcpy(__dest,
                 "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n   GOO"
                 ,0xa0);
          local_1a8.length_ = sVar9;
          __dest[sVar9] = false;
          if ((dump._M_string_length == sVar9) &&
             ((dump._M_string_length == 0 ||
              (iVar11 = bcmp(dump._M_dataplus._M_p,local_1a8.ptr_,dump._M_string_length),
              iVar11 == 0)))) {
            if ((bool *)local_1a8.ptr_ != pbVar2) {
              operator_delete(local_1a8.ptr_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dump._M_dataplus._M_p != paVar1) {
              operator_delete(dump._M_dataplus._M_p);
            }
            ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
            return 0;
          }
          fprintf(_stderr,"Check failed: %s %s %s\n","dump","==","expected");
          goto LAB_00107c94;
        }
        pcVar12 = "peer.ValueIs(string(\"GOO\\0GAR\", 7), string(\"GUX\\0GUUX\", 8))";
      }
      else {
        pcVar12 = "peer.ValueIs(string(\"FOO\\0BAR\", 7), string(\"QUX\\0QUUX\", 8))";
      }
    }
    else {
      pcVar12 = "peer.ValueIs(\"GOO\", \"\")";
    }
  }
  else {
    pcVar12 = "peer.ValueIs(\"FOO\", \"\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar12);
LAB_00107c94:
  exit(1);
}

Assistant:

int main(int argc, char** argv) {

  SetUp();

  const int retval = RUN_ALL_TESTS();

  // This has to run last, so we run it manually
  TestSetValueWithNUL();

  return retval;
}